

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O3

bool __thiscall ON_BoolValue::ReportHelper(ON_BoolValue *this,ON_TextLog *text_log)

{
  long lVar1;
  char *format;
  long lVar2;
  
  lVar2 = (long)(this->m_value).m_count;
  ON_TextLog::Print(text_log,"bool value\n");
  ON_TextLog::PushIndent(text_log);
  if (0 < lVar2) {
    lVar1 = 0;
    do {
      format = "true";
      if ((this->m_value).m_a[lVar1] == false) {
        format = "false";
      }
      ON_TextLog::Print(text_log,format);
      lVar1 = lVar1 + 1;
    } while (lVar2 != lVar1);
  }
  ON_TextLog::PopIndent(text_log);
  return true;
}

Assistant:

bool ON_BoolValue::ReportHelper(ON_TextLog& text_log ) const
{
  int i, count = m_value.Count();
  text_log.Print("bool value\n");
  text_log.PushIndent();
  for ( i = 0; i < count; i++ )
  {
    text_log.Print(m_value[i]?"true":"false");
  }
  text_log.PopIndent();
  return true;
}